

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPIUnpack_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  char *__s;
  ulong uVar4;
  byte local_379;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2d9;
  undefined1 local_2d8 [8];
  string object_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  byte local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Type local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<char> local_121;
  undefined1 local_120 [8];
  string nullableValueAccessOperator;
  undefined1 local_f8 [7];
  bool isNullable;
  string defaultValue;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_80 [8];
  string field_name;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_50;
  const_iterator it;
  string constructor_args;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  string *code;
  
  std::__cxx11::string::string((string *)&it);
  local_50._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin(non_deprecated_fields);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end(non_deprecated_fields);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar1) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_50);
    field_name.field_2._8_8_ = ppVar3->second;
    IdlNamer::Field_abi_cxx11_
              ((string *)local_80,&this->namer_,(FieldDef *)field_name.field_2._8_8_);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&it,",\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   "      ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,": ");
    std::__cxx11::string::operator+=((string *)&it,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&type);
    defaultValue.field_2._8_8_ = field_name.field_2._8_8_ + 200;
    getDefaultValue_abi_cxx11_((string *)local_f8,this,(Value *)(field_name.field_2._8_8_ + 200));
    uVar2 = std::__cxx11::string::empty();
    local_379 = 0;
    if ((uVar2 & 1) != 0) {
      local_379 = struct_def->fixed ^ 0xff;
    }
    nullableValueAccessOperator.field_2._M_local_buf[0xf] = local_379 & 1;
    __s = "";
    if (nullableValueAccessOperator.field_2._M_local_buf[0xf] != 0) {
      __s = "?";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_120,__s,&local_121);
    std::allocator<char>::~allocator(&local_121);
    if (*(int *)defaultValue.field_2._8_8_ == 0xf) {
      std::operator+(&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      std::operator+(&local_148,&local_168,".unpack()");
      std::__cxx11::string::operator+=((string *)&it,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
    }
    else if (*(int *)defaultValue.field_2._8_8_ == 0xe) {
      Type::VectorType(&local_188,(Type *)defaultValue.field_2._8_8_);
      if (local_188.base_type == BASE_TYPE_STRUCT) {
        std::operator+(&local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_120);
        std::operator+(&local_1a8,&local_1c8,".map((e) => e.unpack()).toList()");
        std::__cxx11::string::operator+=((string *)&it,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      else {
        GenReaderTypeName_abi_cxx11_
                  ((string *)((long)&offset.field_2 + 8),this,
                   (Type *)(field_name.field_2._8_8_ + 200),
                   (struct_def->super_Definition).defined_namespace,
                   (FieldDef *)field_name.field_2._8_8_,false,false,true);
        std::__cxx11::string::operator+=((string *)&it,(string *)(offset.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(offset.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)&it,".vTableGet");
        NumToString<unsigned_short>
                  ((string *)local_208,*(unsigned_short *)(field_name.field_2._8_8_ + 0x108));
        local_249 = 0;
        object_type.field_2._M_local_buf[0xf] = '\0';
        object_type.field_2._M_local_buf[0xe] = '\0';
        object_type.field_2._M_local_buf[0xd] = '\0';
        if ((nullableValueAccessOperator.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::operator+(&local_2b0,"(_bc, _bcOffset, ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          object_type.field_2._M_local_buf[0xf] = '\x01';
          std::operator+(&local_290,&local_2b0,", ");
          object_type.field_2._M_local_buf[0xe] = '\x01';
          std::operator+(&local_270,&local_290,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8);
          object_type.field_2._M_local_buf[0xd] = '\x01';
          std::operator+(&local_228,&local_270,")");
        }
        else {
          std::operator+(&local_248,"Nullable(_bc, _bcOffset, ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          local_249 = 1;
          std::operator+(&local_228,&local_248,")");
        }
        std::__cxx11::string::operator+=((string *)&it,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        if ((object_type.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_270);
        }
        if ((object_type.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_290);
        }
        if ((object_type.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_2b0);
        }
        if ((local_249 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_248);
        }
        std::__cxx11::string::~string((string *)local_208);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&it,(string *)local_80);
    }
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_80);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_50);
  }
  IdlNamer::ObjectType_abi_cxx11_((string *)local_2d8,&this->namer_,struct_def);
  local_2d9 = 0;
  std::operator+(&local_340,"  ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  std::operator+(&local_320,&local_340," unpack() => ");
  std::operator+(&local_300,&local_320,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  std::operator+(__return_storage_ptr__,&local_300,"(");
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator+(&local_360,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,");\n");
  local_2d9 = 1;
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructObjectAPIUnpack(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      " + field_name + ": ";

      const Type &type = field.value.type;
      std::string defaultValue = getDefaultValue(field.value);
      bool isNullable = defaultValue.empty() && !struct_def.fixed;
      std::string nullableValueAccessOperator = isNullable ? "?" : "";
      if (type.base_type == BASE_TYPE_STRUCT) {
        constructor_args +=
            field_name + nullableValueAccessOperator + ".unpack()";
      } else if (type.base_type == BASE_TYPE_VECTOR) {
        if (type.VectorType().base_type == BASE_TYPE_STRUCT) {
          constructor_args += field_name + nullableValueAccessOperator +
                              ".map((e) => e.unpack()).toList()";
        } else {
          constructor_args +=
              GenReaderTypeName(field.value.type, struct_def.defined_namespace,
                                field, false, false);
          constructor_args += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          constructor_args +=
              isNullable
                  ? "Nullable(_bc, _bcOffset, " + offset + ")"
                  : "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
        }
      } else {
        constructor_args += field_name;
      }
    }

    const std::string object_type = namer_.ObjectType(struct_def);
    std::string code = "  " + object_type + " unpack() => " + object_type + "(";
    if (!constructor_args.empty()) code += "\n" + constructor_args;
    code += ");\n";
    return code;
  }